

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O1

void fight_prog_drow_talisman(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *victim;
  int level;
  
  bVar1 = is_worn(obj);
  if (bVar1) {
    iVar2 = number_percent();
    if ((iVar2 < 8) && (ch->fighting != (CHAR_DATA *)0x0)) {
      act("$p pulses and glows a sickly shade of green!",ch,obj,(void *)0x0,4);
      iVar2 = number_percent();
      if (iVar2 < 0x33) {
        iVar2 = skill_lookup("acid blast");
        victim = ch->fighting;
        level = 0x3c;
      }
      else {
        iVar2 = skill_lookup("frost breath");
        level = (int)ch->level;
        victim = ch->fighting;
      }
      obj_cast_spell(iVar2,level,ch,victim,obj);
      return;
    }
  }
  return;
}

Assistant:

void fight_prog_drow_talisman(OBJ_DATA *obj, CHAR_DATA *ch)
{
	if (!is_worn(obj) || number_percent() > 7 || !ch->fighting)
		return;

	act("$p pulses and glows a sickly shade of green!", ch, obj, 0, TO_ALL);

	if (number_percent() > 50)
		obj_cast_spell(skill_lookup("frost breath"), ch->level, ch, ch->fighting, obj);
	else
		obj_cast_spell(skill_lookup("acid blast"), 60, ch, ch->fighting, obj);
}